

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

bool __thiscall
ImplicitDepLoader::ProcessDepfileDeps
          (ImplicitDepLoader *this,Edge *edge,
          vector<StringPiece,_std::allocator<StringPiece>_> *depfile_ins,string *err)

{
  uint64_t in_RAX;
  iterator iVar1;
  Node *this_00;
  StringPiece *pSVar2;
  uint64_t slash_bits;
  uint64_t local_38;
  
  local_38 = in_RAX;
  iVar1 = PreallocateSpace(this,edge,
                           (int)((ulong)((long)(depfile_ins->
                                               super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(depfile_ins->
                                              super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                                              )._M_impl.super__Vector_impl_data._M_start) >> 4));
  for (pSVar2 = (depfile_ins->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl
                .super__Vector_impl_data._M_start;
      pSVar2 != (depfile_ins->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl
                .super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
    CanonicalizePath(pSVar2->str_,&pSVar2->len_,&local_38);
    this_00 = State::GetNode(this->state_,*pSVar2,local_38);
    *iVar1._M_current = this_00;
    Node::AddOutEdge(this_00,edge);
    CreatePhonyInEdge(this,this_00);
    iVar1._M_current = iVar1._M_current + 1;
  }
  return true;
}

Assistant:

bool ImplicitDepLoader::ProcessDepfileDeps(
    Edge* edge, std::vector<StringPiece>* depfile_ins, std::string* err) {
  // Preallocate space in edge->inputs_ to be filled in below.
  vector<Node*>::iterator implicit_dep =
      PreallocateSpace(edge, depfile_ins->size());

  // Add all its in-edges.
  for (std::vector<StringPiece>::iterator i = depfile_ins->begin();
       i != depfile_ins->end(); ++i, ++implicit_dep) {
    uint64_t slash_bits;
    CanonicalizePath(const_cast<char*>(i->str_), &i->len_, &slash_bits);
    Node* node = state_->GetNode(*i, slash_bits);
    *implicit_dep = node;
    node->AddOutEdge(edge);
    CreatePhonyInEdge(node);
  }

  return true;
}